

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  bool bVar1;
  bool bVar2;
  char *value;
  string *in_base;
  IncludeScope incScope;
  string filenametoread;
  cmListFile listFile;
  allocator<char> local_89;
  IncludeScope local_88;
  string local_78;
  undefined1 local_58 [32];
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_CURRENT_LIST_FILE",&local_89);
  value = GetDefinition(this,&local_78);
  AddDefinition(this,(string *)local_58,value);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_78,filename,in_base);
  IncludeScope::IncludeScope(&local_88,this,&local_78,noPolicyScope);
  local_58._24_8_ = &local_30;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_58._16_8_ = 0;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  bVar1 = cmListFile::ParseFile
                    ((cmListFile *)local_58,local_78._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)local_58,&local_78);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_88.ReportError = false;
    }
  }
  cmListFile::~cmListFile((cmListFile *)local_58);
  IncludeScope::~IncludeScope(&local_88);
  std::__cxx11::string::~string((string *)&local_78);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    incScope.Quiet();
  }
  return true;
}